

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

uint32_t helper_bcds_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  _Bool _Var1;
  int iVar2;
  undefined1 local_58 [8];
  ppc_avr_t ret;
  int local_3c;
  _Bool local_35;
  int sgnb;
  uint uStack_30;
  _Bool ox_flag;
  int i;
  int cr;
  uint32_t ps_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  sgnb = (int)a->s8[8];
  local_35 = false;
  i = ps;
  _cr = b;
  b_local = a;
  a_local = r;
  local_3c = bcd_get_sgn(b);
  ret.u64[0] = _cr->u64[1];
  local_58 = (undefined1  [8])(_cr->u64[0] & 0xfffffffffffffff0);
  _Var1 = bcd_is_valid(_cr);
  if (_Var1) {
    if (sgnb < 0x20) {
      if (sgnb < -0x1f) {
        sgnb = -0x1f;
      }
    }
    else {
      sgnb = 0x1f;
    }
    if (sgnb < 1) {
      urshift((uint64_t *)local_58,ret.u64,sgnb * -4);
    }
    else {
      ulshift((uint64_t *)local_58,ret.u64,sgnb << 2,&local_35);
    }
    iVar2 = bcd_preferred_sgn(local_3c,i);
    bcd_put_digit((ppc_avr_t *)local_58,(uint8_t)iVar2,0);
    a_local->u64[0] = (uint64_t)local_58;
    a_local->u64[1] = ret.u64[0];
    uStack_30 = bcd_cmp_zero(a_local);
    if ((local_35 & 1U) != 0) {
      uStack_30 = uStack_30 | 1;
    }
    r_local._4_4_ = uStack_30;
  }
  else {
    r_local._4_4_ = 1;
  }
  return r_local._4_4_;
}

Assistant:

uint32_t helper_bcds(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int i = a->VsrSB(7);
    bool ox_flag = false;
    int sgnb = bcd_get_sgn(b);
    ppc_avr_t ret = *b;
    ret.VsrD(1) &= ~0xf;

    if (bcd_is_valid(b) == false) {
        return CRF_SO;
    }

    if (unlikely(i > 31)) {
        i = 31;
    } else if (unlikely(i < -31)) {
        i = -31;
    }

    if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);
    }
    bcd_put_digit(&ret, bcd_preferred_sgn(sgnb, ps), 0);

    *r = ret;

    cr = bcd_cmp_zero(r);
    if (ox_flag) {
        cr |= CRF_SO;
    }

    return cr;
}